

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::~RpcRequest(RpcRequest *this)

{
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar1;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar2;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar3;
  ArrayDisposer *pAVar4;
  OutgoingRpcMessage *pOVar5;
  Disposer *pDVar6;
  RpcClient *pRVar7;
  RpcConnectionState *pRVar8;
  
  (this->capTable).super_CapTableBuilder.super_CapTableReader._vptr_CapTableReader =
       (_func_int **)&PTR_extractCap_006cbfb0;
  pMVar1 = (this->capTable).table.builder.ptr;
  if (pMVar1 != (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
    pRVar2 = (this->capTable).table.builder.pos;
    pMVar3 = (this->capTable).table.builder.endPtr;
    (this->capTable).table.builder.ptr = (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    (this->capTable).table.builder.pos = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0
    ;
    (this->capTable).table.builder.endPtr =
         (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    pAVar4 = (this->capTable).table.builder.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pMVar1,0x10,(long)pRVar2 - (long)pMVar1 >> 4,(long)pMVar3 - (long)pMVar1 >> 4,
               kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>
               ::destruct);
  }
  pOVar5 = (this->message).ptr;
  if (pOVar5 != (OutgoingRpcMessage *)0x0) {
    (this->message).ptr = (OutgoingRpcMessage *)0x0;
    pDVar6 = (this->message).disposer;
    (**pDVar6->_vptr_Disposer)
              (pDVar6,pOVar5->_vptr_OutgoingRpcMessage[-2] + (long)&pOVar5->_vptr_OutgoingRpcMessage
              );
  }
  pRVar7 = (this->target).ptr;
  if (pRVar7 != (RpcClient *)0x0) {
    (this->target).ptr = (RpcClient *)0x0;
    pDVar6 = (this->target).disposer;
    (**pDVar6->_vptr_Disposer)
              (pDVar6,(_func_int *)
                      ((long)&(pRVar7->super_ClientHook)._vptr_ClientHook +
                      (long)(pRVar7->super_ClientHook)._vptr_ClientHook[-2]));
  }
  pRVar8 = (this->connectionState).ptr;
  if (pRVar8 != (RpcConnectionState *)0x0) {
    (this->connectionState).ptr = (RpcConnectionState *)0x0;
    pDVar6 = (this->connectionState).disposer;
    (**pDVar6->_vptr_Disposer)
              (pDVar6,(pRVar8->super_ErrorHandler)._vptr_ErrorHandler[-2] +
                      (long)&(pRVar8->super_ErrorHandler)._vptr_ErrorHandler);
    return;
  }
  return;
}

Assistant:

class RpcRequest final: public RequestHook {
  public:
    RpcRequest(RpcConnectionState& connectionState, VatNetworkBase::Connection& connection,
               kj::Maybe<MessageSize> sizeHint, kj::Own<RpcClient>&& target)
        : RequestHook(connectionState.brand.get()),
          connectionState(kj::addRef(connectionState)),
          target(kj::mv(target)),
          message(connection.newOutgoingMessage(
              firstSegmentSize(sizeHint, messageSizeHint<rpc::Call>() +
                  sizeInWords<rpc::Payload>() + MESSAGE_TARGET_SIZE_HINT))),
          callBuilder(message->getBody().getAs<rpc::Message>().initCall()),
          paramsBuilder(capTable.imbue(callBuilder.getParams().getContent())) {}

    bool isOnConnection(RpcConnectionState& expected) {
      return connectionState.get() == &expected;
    }

    inline AnyPointer::Builder getRoot() {
      return paramsBuilder;
    }
    inline rpc::Call::Builder getCall() {
      return callBuilder;
    }

    RemotePromise<AnyPointer> send() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        // TODO(bug): Seems like we should check for redirect before this?
        const kj::Exception& e = connectionState->connection.get<Disconnected>();
        return RemotePromise<AnyPointer>(
            kj::Promise<Response<AnyPointer>>(kj::cp(e)),
            AnyPointer::Pipeline(newBrokenPipeline(kj::cp(e))));
      }

      KJ_IF_SOME(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize(),
            callHintsFromReader(callBuilder));
        replacement.set(paramsBuilder);
        return replacement.send();
      } else {
        bool noPromisePipelining = callBuilder.getNoPromisePipelining();

        auto sendResult = sendInternal(false);

        kj::Own<PipelineHook> pipeline;
        if (noPromisePipelining) {
          pipeline = getDisabledPipeline();
        } else {
          auto forkedPromise = sendResult.promise.fork();

          // The pipeline must get notified of resolution before the app does to maintain ordering.
          pipeline = kj::refcounted<RpcPipeline>(
              *connectionState, kj::mv(sendResult.questionRef), forkedPromise.addBranch());

          sendResult.promise = forkedPromise.addBranch();
        }

        auto appPromise = sendResult.promise.then(
            [=](kj::Own<RpcResponse>&& response) {
              auto reader = response->getResults();
              return Response<AnyPointer>(reader, kj::mv(response));
            });

        return RemotePromise<AnyPointer>(
            kj::mv(appPromise),
            AnyPointer::Pipeline(kj::mv(pipeline)));
      }
    }

    kj::Promise<void> sendStreaming() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        // TODO(bug): Seems like we should check for redirect before this?
        return kj::cp(connectionState->connection.get<Disconnected>());
      }

      KJ_IF_SOME(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize(),
            callHintsFromReader(callBuilder));
        replacement.set(paramsBuilder);
        return RequestHook::from(kj::mv(replacement))->sendStreaming();
      } else {
        return sendStreamingInternal(false);
      }
    }